

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

void __thiscall
t_php_generator::generate_php_type_spec(t_php_generator *this,ostream *out,t_type *t)

{
  int *piVar1;
  int iVar2;
  t_type *ptVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  t_type *type;
  undefined8 *puVar5;
  char *pcVar6;
  string local_50;
  
  ptVar3 = t_type::get_true_type(t);
  poVar4 = t_generator::indent((t_generator *)this,out);
  pcVar6 = "\'type\' => ";
  poVar4 = std::operator<<(poVar4,"\'type\' => ");
  type_to_enum_abi_cxx11_(&local_50,(t_php_generator *)pcVar6,ptVar3);
  poVar4 = std::operator<<(poVar4,(string *)&local_50);
  poVar4 = std::operator<<(poVar4,",");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[5])(ptVar3);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[0xb])(ptVar3);
    if ((((char)iVar2 == '\0') &&
        (iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[0xc])(ptVar3), (char)iVar2 == '\0')) &&
       (iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[10])(ptVar3), (char)iVar2 == '\0')) {
      iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[0x10])(ptVar3);
      if ((char)iVar2 == '\0') {
        iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[0xe])(ptVar3);
        if (((char)iVar2 == '\0') &&
           (iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[0xf])(ptVar3), (char)iVar2 == '\0')) {
          puVar5 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar5 = "compiler error: no type for php struct spec field";
          __cxa_throw(puVar5,&char_const*::typeinfo,0);
        }
        (*(ptVar3->super_t_doc)._vptr_t_doc[0xe])(ptVar3);
        ptVar3 = t_type::get_true_type(*(t_type **)&ptVar3[1].super_t_doc.has_doc_);
        poVar4 = t_generator::indent((t_generator *)this,out);
        pcVar6 = "\'etype\' => ";
        poVar4 = std::operator<<(poVar4,"\'etype\' => ");
        type_to_enum_abi_cxx11_(&local_50,(t_php_generator *)pcVar6,ptVar3);
        poVar4 = std::operator<<(poVar4,(string *)&local_50);
        poVar4 = std::operator<<(poVar4,",");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_50);
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"\'elem\' => array(");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        generate_php_type_spec(this,out,ptVar3);
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"),");
      }
      else {
        type = t_type::get_true_type(*(t_type **)&ptVar3[1].super_t_doc.has_doc_);
        ptVar3 = t_type::get_true_type(*(t_type **)&ptVar3[1].annotations_._M_t._M_impl);
        poVar4 = t_generator::indent((t_generator *)this,out);
        pcVar6 = "\'ktype\' => ";
        poVar4 = std::operator<<(poVar4,"\'ktype\' => ");
        type_to_enum_abi_cxx11_(&local_50,(t_php_generator *)pcVar6,type);
        poVar4 = std::operator<<(poVar4,(string *)&local_50);
        poVar4 = std::operator<<(poVar4,",");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_50);
        poVar4 = t_generator::indent((t_generator *)this,out);
        pcVar6 = "\'vtype\' => ";
        poVar4 = std::operator<<(poVar4,"\'vtype\' => ");
        type_to_enum_abi_cxx11_(&local_50,(t_php_generator *)pcVar6,ptVar3);
        poVar4 = std::operator<<(poVar4,(string *)&local_50);
        poVar4 = std::operator<<(poVar4,",");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_50);
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"\'key\' => array(");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        generate_php_type_spec(this,out,type);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"),");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"\'val\' => array(");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        generate_php_type_spec(this,out,ptVar3);
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"),");
      }
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      return;
    }
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"\'class\' => \'");
    php_namespace_abi_cxx11_(&local_50,this,ptVar3->program_);
    poVar4 = std::operator<<(poVar4,(string *)&local_50);
    iVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[3])(ptVar3);
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar2));
    poVar4 = std::operator<<(poVar4,"\',");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void t_php_generator::generate_php_type_spec(ostream& out, t_type* t) {
  t = get_true_type(t);
  indent(out) << "'type' => " << type_to_enum(t) << "," << endl;

  if (t->is_base_type()) {
    // Noop, type is all we need
  } else if (t->is_struct() || t->is_xception() || t->is_enum()) {
    indent(out) << "'class' => '" << php_namespace(t->get_program()) << t->get_name() << "',"
                << endl;
  } else if (t->is_map()) {
    t_type* ktype = get_true_type(((t_map*)t)->get_key_type());
    t_type* vtype = get_true_type(((t_map*)t)->get_val_type());
    indent(out) << "'ktype' => " << type_to_enum(ktype) << "," << endl;
    indent(out) << "'vtype' => " << type_to_enum(vtype) << "," << endl;
    indent(out) << "'key' => array(" << endl;
    indent_up();
    generate_php_type_spec(out, ktype);
    indent_down();
    indent(out) << ")," << endl;
    indent(out) << "'val' => array(" << endl;
    indent_up();
    generate_php_type_spec(out, vtype);
    indent(out) << ")," << endl;
    indent_down();
  } else if (t->is_list() || t->is_set()) {
    t_type* etype;
    if (t->is_list()) {
      etype = get_true_type(((t_list*)t)->get_elem_type());
    } else {
      etype = get_true_type(((t_set*)t)->get_elem_type());
    }
    indent(out) << "'etype' => " << type_to_enum(etype) << "," << endl;
    indent(out) << "'elem' => array(" << endl;
    indent_up();
    generate_php_type_spec(out, etype);
    indent(out) << ")," << endl;
    indent_down();
  } else {
    throw "compiler error: no type for php struct spec field";
  }
}